

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::global_appentries_dir(Path *__return_storage_ptr__,localpathtype local)

{
  localpathtype lVar1;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  localpathtype local_14;
  Path *pPStack_10;
  localpathtype local_local;
  
  local_14 = local;
  pPStack_10 = __return_storage_ptr__;
  if (local == LOCALPATH_LOCAL) {
LAB_001143fb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"/usr/local/share/applications",&local_39);
    Path(__return_storage_ptr__,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    if (local == LOCALPATH_DEFAULT) {
      lVar1 = get_global_dir_default();
      if (lVar1 == LOCALPATH_LOCAL) goto LAB_001143fb;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"/usr/share/applications",&local_71);
    Path(__return_storage_ptr__,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_appentries_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
  if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/usr/local/share/applications");
  else
    return Path("/usr/share/applications");
#elif defined(_WIN32)
  wchar_t dir[MAX_PATH];
  HRESULT result = SHGetFolderPathW(NULL, CSIDL_COMMON_STARTMENU, NULL, SHGFP_TYPE_CURRENT, dir);
  if (result != S_OK)
    throw(Pathie::WindowsHresultError(result));

  return Path(utf16_to_utf8(dir));
#else
#error Unsupported system.
#endif
}